

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FloatPtexTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FloatPtexTexture *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_30;
  
  PtexTextureBase::BaseToString_abi_cxx11_(&local_30,&this->super_PtexTextureBase);
  StringPrintf<std::__cxx11::string>
            (__return_storage_ptr__,(pbrt *)"[ FloatPtexTexture %s ]",(char *)&local_30,in_RCX);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatPtexTexture::ToString() const {
    return StringPrintf("[ FloatPtexTexture %s ]", BaseToString());
}